

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O2

void Rwr_MarkUsed_rec(Rwr_Man_t *p,Rwr_Node_t *pNode)

{
  for (; ((*(uint *)&pNode->field_0xe >> 0x1e & 1) == 0 && (pNode->TravId != p->nTravIds));
      pNode = (Rwr_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe)) {
    pNode->TravId = p->nTravIds;
    *(uint *)&pNode->field_0xe = *(uint *)&pNode->field_0xe | 0x40000000;
    Rwr_MarkUsed_rec(p,(Rwr_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

void Rwr_MarkUsed_rec( Rwr_Man_t * p, Rwr_Node_t * pNode )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    pNode->fUsed = 1;
    Rwr_MarkUsed_rec( p, Rwr_Regular(pNode->p0) );
    Rwr_MarkUsed_rec( p, Rwr_Regular(pNode->p1) );
}